

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_parse.cc
# Opt level: O3

void yy_symbol_print(FILE *yyo,yysymbol_kind_t yykind,YYSTYPE *yyvaluep)

{
  char *pcVar1;
  
  pcVar1 = "nterm";
  if (yykind < YYSYMBOL_YYACCEPT) {
    pcVar1 = "token";
  }
  fprintf((FILE *)yyo,"%s %s (",pcVar1,yytname[yykind]);
  fputc(0x29,(FILE *)yyo);
  return;
}

Assistant:

static void
yy_symbol_print (FILE *yyo,
                 yysymbol_kind_t yykind, YYSTYPE const * const yyvaluep)
{
  YYFPRINTF (yyo, "%s %s (",
             yykind < YYNTOKENS ? "token" : "nterm", yysymbol_name (yykind));

  yy_symbol_value_print (yyo, yykind, yyvaluep);
  YYFPRINTF (yyo, ")");
}